

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

void __thiscall
btConvexHullInternal::Pool<btConvexHullInternal::Vertex>::~Pool
          (Pool<btConvexHullInternal::Vertex> *this)

{
  PoolArray<btConvexHullInternal::Vertex> *ptr;
  
  while (ptr = this->arrays, ptr != (PoolArray<btConvexHullInternal::Vertex> *)0x0) {
    this->arrays = ptr->next;
    btAlignedFreeInternal(ptr->array);
    btAlignedFreeInternal(ptr);
  }
  return;
}

Assistant:

~Pool()
				{
					while (arrays)
					{
						PoolArray<T>* p = arrays;
						arrays = p->next;
						p->~PoolArray<T>();
						btAlignedFree(p);
					}
				}